

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_client.c
# Opt level: O1

int ssl_parse_ecjpake_kkpp(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  uint8_t *puVar1;
  int iVar2;
  
  iVar2 = mbedtls_ecjpake_check(&ssl->handshake->ecjpake_ctx);
  if (iVar2 == 0) {
    iVar2 = mbedtls_ecjpake_read_round_one(&ssl->handshake->ecjpake_ctx,buf,len);
    if (iVar2 == 0) {
      puVar1 = &ssl->handshake->cli_exts;
      *puVar1 = *puVar1 | 2;
      iVar2 = 0;
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                 ,0x144,"mbedtls_ecjpake_read_round_one",iVar2);
      mbedtls_ssl_send_alert_message(ssl,'\x02','/');
    }
  }
  else {
    iVar2 = 0;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0x12e,"skip ecjpake kkpp extension");
  }
  return iVar2;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_parse_ecjpake_kkpp(mbedtls_ssl_context *ssl,
                                  const unsigned char *buf,
                                  size_t len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (ssl->handshake->ciphersuite_info->key_exchange !=
        MBEDTLS_KEY_EXCHANGE_ECJPAKE) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("skip ecjpake kkpp extension"));
        return 0;
    }

    /* If we got here, we no longer need our cached extension */
    mbedtls_free(ssl->handshake->ecjpake_cache);
    ssl->handshake->ecjpake_cache = NULL;
    ssl->handshake->ecjpake_cache_len = 0;

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if ((ret = mbedtls_psa_ecjpake_read_round(
             &ssl->handshake->psa_pake_ctx, buf, len,
             MBEDTLS_ECJPAKE_ROUND_ONE)) != 0) {
        psa_destroy_key(ssl->handshake->psa_pake_password);
        psa_pake_abort(&ssl->handshake->psa_pake_ctx);

        MBEDTLS_SSL_DEBUG_RET(1, "psa_pake_input round one", ret);
        mbedtls_ssl_send_alert_message(
            ssl,
            MBEDTLS_SSL_ALERT_LEVEL_FATAL,
            MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE);
        return ret;
    }

    return 0;
#else
    if ((ret = mbedtls_ecjpake_read_round_one(&ssl->handshake->ecjpake_ctx,
                                              buf, len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ecjpake_read_round_one", ret);
        mbedtls_ssl_send_alert_message(
            ssl,
            MBEDTLS_SSL_ALERT_LEVEL_FATAL,
            MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE);
        return ret;
    }

    return 0;
#endif /* MBEDTLS_USE_PSA_CRYPTO */
}